

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  int iVar1;
  ostream *poVar2;
  internal *piVar3;
  TestResult *this;
  TestCase *pTVar4;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *result;
  long in_FS_OFFSET;
  int local_298;
  int i;
  UnitTest *unit_test_local;
  ostream *stream_local;
  allocator<char> local_26d;
  allocator<char> local_26c;
  allocator<char> local_26b;
  allocator<char> local_26a;
  allocator<char> local_269;
  int local_268;
  allocator<char> local_261;
  int local_260;
  allocator<char> local_259;
  int local_258;
  allocator<char> local_252;
  allocator<char> local_251;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  string kTestsuites;
  
  kTestsuites.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"testsuites",&local_251);
  std::allocator<char>::~allocator(&local_251);
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar2 = std::operator<<(stream,"<");
  std::operator<<(poVar2,(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"tests",&local_252);
  local_258 = UnitTest::reportable_test_count(unit_test);
  StreamableToString<int>(&local_70,&local_258);
  OutputXmlAttribute(stream,(string *)local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_252);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"failures",&local_259);
  local_260 = UnitTest::failed_test_count(unit_test);
  StreamableToString<int>(&local_b0,&local_260);
  OutputXmlAttribute(stream,(string *)local_30,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"disabled",&local_261);
  local_268 = UnitTest::reportable_disabled_test_count(unit_test);
  StreamableToString<int>(&local_f0,&local_268);
  OutputXmlAttribute(stream,(string *)local_30,&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"errors",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"0",&local_26a);
  OutputXmlAttribute(stream,(string *)local_30,&local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_26a);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"timestamp",&local_26b);
  piVar3 = (internal *)UnitTest::start_timestamp(unit_test);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_170,piVar3,ms);
  OutputXmlAttribute(stream,(string *)local_30,&local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_26b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"time",&local_26c);
  piVar3 = (internal *)UnitTest::elapsed_time(unit_test);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_1b0,piVar3,ms_00);
  OutputXmlAttribute(stream,(string *)local_30,&local_190,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_26c);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"random_seed",&local_26d);
    stream_local._4_4_ = UnitTest::random_seed(unit_test);
    StreamableToString<int>(&local_1f0,(int *)((long)&stream_local + 4));
    OutputXmlAttribute(stream,(string *)local_30,&local_1d0,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_26d);
  }
  this = UnitTest::ad_hoc_test_result(unit_test);
  TestPropertiesAsXmlAttributes_abi_cxx11_(&local_210,(XmlUnitTestResultPrinter *)this,result);
  std::operator<<(stream,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"name",(allocator<char> *)((long)&stream_local + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"AllTests",(allocator<char> *)((long)&stream_local + 2));
  OutputXmlAttribute(stream,(string *)local_30,&local_230,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 2));
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 3));
  std::operator<<(stream,">\n");
  local_298 = 0;
  while( true ) {
    iVar1 = UnitTest::total_test_case_count(unit_test);
    if (iVar1 <= local_298) break;
    pTVar4 = UnitTest::GetTestCase(unit_test,local_298);
    iVar1 = TestCase::reportable_test_count(pTVar4);
    if (0 < iVar1) {
      pTVar4 = UnitTest::GetTestCase(unit_test,local_298);
      PrintXmlTestCase(stream,pTVar4);
    }
    local_298 = local_298 + 1;
  }
  poVar2 = std::operator<<(stream,"</");
  poVar2 = std::operator<<(poVar2,(string *)local_30);
  std::operator<<(poVar2,">\n");
  std::__cxx11::string::~string((string *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == kTestsuites.field_2._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));

  if (GTEST_FLAG(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }
  *stream << TestPropertiesAsXmlAttributes(unit_test.ad_hoc_test_result());

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0)
      PrintXmlTestCase(stream, *unit_test.GetTestCase(i));
  }
  *stream << "</" << kTestsuites << ">\n";
}